

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O2

int32_t dtl_json_dump(dtl_dv_t *dv,FILE *fh,int32_t indent,_Bool sortKeys)

{
  dtl_json_writer_t writer;
  
  writer.outputType = '\x01';
  writer.indentWidth = 0;
  writer.currentIndent = 0;
  writer.indentArray = (adt_bytearray_t *)0x0;
  writer.destStr = (adt_str_t *)0x0;
  writer.newLineStr = "\n";
  writer.sortKeys = false;
  writer.destFile = fh;
  if (0 < indent) {
    dtl_json_writer_setIndentWidth(&writer,indent);
  }
  if (sortKeys) {
    writer.sortKeys = true;
  }
  dtl_json_writer_write_dv(&writer,dv,true);
  dtl_json_writer_destroy(&writer,false);
  return 0;
}

Assistant:

int32_t dtl_json_dump(const dtl_dv_t *dv, FILE *fh, int32_t indent, bool sortKeys)
{
   dtl_json_writer_t writer;
   dtl_json_writer_createWithFile(&writer, fh);
   if (indent > 0)
   {
      dtl_json_writer_setIndentWidth(&writer, indent);
   }
   if (sortKeys)
   {
      dtl_json_writer_setSortKeys(&writer, true);
   }
   dtl_json_writer_write_dv(&writer, dv, true);
   dtl_json_writer_destroy(&writer, false);
   return 0;
}